

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupInvMiter(Gia_Man_t *p,Gia_Man_t *pInv)

{
  int iVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int Node;
  int Node2;
  int Node1;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pInv_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43c,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManRegNum(pInv);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(pInv) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43d,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManCoNum(pInv);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManCoNum(pInv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43e,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Gia_ManRegNum(p);
  iVar2 = Gia_ManCiNum(pInv);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManRegNum(p) == Gia_ManCiNum(pInv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43f,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  iVar2 = Gia_ManObjNum(pInv);
  p_00 = Gia_ManStart(iVar1 + iVar2 * 2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  Node2 = 1;
  while( true ) {
    bVar7 = false;
    if (Node2 < p->nObjs) {
      _Node1 = Gia_ManObj(p,Node2);
      bVar7 = _Node1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_Node1);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(_Node1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(_Node1);
        if (iVar1 != 0) {
          uVar3 = Gia_ObjFanin0Copy(_Node1);
          _Node1->Value = uVar3;
        }
      }
      else {
        uVar3 = Gia_ManAppendCi(p_00);
        _Node1->Value = uVar3;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(_Node1);
      iVar2 = Gia_ObjFanin1Copy(_Node1);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      _Node1->Value = uVar3;
    }
    Node2 = Node2 + 1;
  }
  Node2 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Node2 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _Node1 = Gia_ManCi(p,iVar1 + Node2);
      bVar7 = _Node1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = _Node1->Value;
    pGVar5 = Gia_ManCi(pInv,Node2);
    pGVar5->Value = uVar3;
    Node2 = Node2 + 1;
  }
  Node2 = 0;
  while( true ) {
    bVar7 = false;
    if (Node2 < pInv->nObjs) {
      _Node1 = Gia_ManObj(pInv,Node2);
      bVar7 = _Node1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_Node1);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_Node1);
      iVar2 = Gia_ObjFanin1Copy(_Node1);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      _Node1->Value = uVar3;
    }
    Node2 = Node2 + 1;
  }
  _Node1 = Gia_ManCo(pInv,0);
  iVar1 = Gia_ObjFanin0Copy(_Node1);
  Node2 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar7 = false;
    if (Node2 < iVar2) {
      iVar2 = Gia_ManPoNum(p);
      _Node1 = Gia_ManCo(p,iVar2 + Node2);
      bVar7 = _Node1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = _Node1->Value;
    pGVar5 = Gia_ManCi(pInv,Node2);
    pGVar5->Value = uVar3;
    Node2 = Node2 + 1;
  }
  Node2 = 0;
  while( true ) {
    bVar7 = false;
    if (Node2 < pInv->nObjs) {
      _Node1 = Gia_ManObj(pInv,Node2);
      bVar7 = _Node1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjIsAnd(_Node1);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(_Node1);
      iLit1 = Gia_ObjFanin1Copy(_Node1);
      uVar3 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      _Node1->Value = uVar3;
    }
    Node2 = Node2 + 1;
  }
  pGVar5 = Gia_ManCo(pInv,0);
  iVar2 = Gia_ObjFanin0Copy(pGVar5);
  iVar2 = Abc_LitNot(iVar2);
  iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
  Gia_ManAppendCo(p_00,iVar1);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupInvMiter( Gia_Man_t * p, Gia_Man_t * pInv )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Node1, Node2, Node;
    assert( Gia_ManRegNum(p) > 0 );
    assert( Gia_ManRegNum(pInv) == 0 );
    assert( Gia_ManCoNum(pInv) == 1 );
    assert( Gia_ManRegNum(p) == Gia_ManCiNum(pInv) );
    Gia_ManFillValue(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2*Gia_ManObjNum(pInv) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    // build invariant on top of register outputs in the first frame
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node1 = Gia_ObjFanin0Copy(pObj);
    // build invariant on top of register outputs in the second frame
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node2 = Gia_ObjFanin0Copy(pObj);
    // create miter output
    Node = Gia_ManHashAnd( pNew, Node1, Abc_LitNot(Node2) );
    Gia_ManAppendCo( pNew, Node );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}